

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O3

void __thiscall
iqxmlrpc::http::Header::register_validator
          (Header *this,string *name,Option_validator_fn *fn,Verification_level level)

{
  vtable_base *pvVar1;
  function_buffer *pfVar2;
  Option_validator v;
  Option_validator local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>
  local_60;
  
  local_88.fn.
  super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  pvVar1 = (fn->
           super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).super_function_base.vtable;
  local_88.level = level;
  if (pvVar1 != (vtable_base *)0x0) {
    pfVar2 = &(fn->
              super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ).super_function_base.functor;
    local_88.fn.
    super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    .super_function_base.vtable = pvVar1;
    if (((ulong)pvVar1 & 1) == 0) {
      (*pvVar1->manager)(pfVar2,&local_88.fn.
                                 super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                 .super_function_base.functor,clone_functor_tag);
    }
    else {
      local_88.fn.
      super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .super_function_base.functor._16_8_ =
           *(undefined8 *)
            ((long)&(fn->
                    super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    ).super_function_base.functor + 0x10);
      local_88.fn.
      super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)pfVar2;
      local_88.fn.
      super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .super_function_base.functor._8_8_ =
           *(undefined8 *)
            ((long)&(fn->
                    super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    ).super_function_base.functor + 8);
    }
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>
  ::pair<iqxmlrpc::http::Header::Option_validator_&,_true>(&local_60,name,&local_88);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>,std::_Select1st<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>>
  ::_M_emplace_equal<std::pair<std::__cxx11::string,iqxmlrpc::http::Header::Option_validator>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>,std::_Select1st<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>>
              *)&this->validators_,&local_60);
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_60.second.fn.
                super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_88.fn.
                super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              );
  return;
}

Assistant:

void Header::register_validator(
  const std::string& name,
  Header::Option_validator_fn fn,
  Verification_level level)
{
  Option_validator v = { level, fn };
  validators_.insert(std::make_pair(name, v));
}